

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O0

char * archive_liblz4_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_liblz4_version(void)
{
#if HAVE_LZ4_H && HAVE_LIBLZ4
#if LZ4_VERSION_NUMBER > 10705
	return LZ4_versionString();
#elif LZ4_VERSION_NUMBER > 10300
	div_t major = div(LZ4_versionNumber(), 10000);
	div_t minor = div(major.rem, 100);
	static char lz4_version[9];
	snprintf(lz4_version, 9, "%d.%d.%d", major.quot, minor.quot, minor.rem);
	return lz4_version;
#else
#define str(s) #s
#define NUMBER(x) str(x)
	return NUMBER(LZ4_VERSION_MAJOR) "." NUMBER(LZ4_VERSION_MINOR) "." NUMBER(LZ4_VERSION_RELEASE);
#undef NUMBER
#undef str
#endif
#else
	return NULL;
#endif
}